

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void JS_SetConstructor2(JSContext *ctx,JSValue func_obj,JSValue proto,int proto_flags,int ctor_flags
                       )

{
  if (0xfffffff4 < (uint)proto.tag) {
    *(int *)proto.u.ptr = *proto.u.ptr + 1;
  }
  JS_DefinePropertyValue(ctx,func_obj,0x3b,proto,proto_flags);
  if (0xfffffff4 < (uint)func_obj.tag) {
    *(int *)func_obj.u.ptr = *func_obj.u.ptr + 1;
  }
  JS_DefinePropertyValue(ctx,proto,0x3c,func_obj,ctor_flags);
  return;
}

Assistant:

static void JS_SetConstructor2(JSContext *ctx,
                               JSValueConst func_obj,
                               JSValueConst proto,
                               int proto_flags, int ctor_flags)
{
    JS_DefinePropertyValue(ctx, func_obj, JS_ATOM_prototype,
                           JS_DupValue(ctx, proto), proto_flags);
    JS_DefinePropertyValue(ctx, proto, JS_ATOM_constructor,
                           JS_DupValue(ctx, func_obj),
                           ctor_flags);
    set_cycle_flag(ctx, func_obj);
    set_cycle_flag(ctx, proto);
}